

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lennard.c
# Opt level: O0

void computeProperties(int natoms,double potentialEnergy,double *totalEnergy)

{
  double *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  double *a;
  double *x;
  double *v;
  double vir;
  double kineticEnergy;
  int natms;
  int ld;
  int hi;
  int lo;
  int p;
  int i;
  int in_stack_00000050;
  int *in_stack_00000080;
  void *in_stack_00000088;
  int *in_stack_00000090;
  int *in_stack_00000098;
  int in_stack_000000a4;
  undefined4 local_58;
  int in_stack_ffffffffffffffac;
  double *in_stack_ffffffffffffffb0;
  long local_48;
  double local_40;
  double local_38;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_38 = 0.0;
  local_40 = 0.0;
  GA_Sync();
  NGA_Distribution(natoms,in_stack_00000050,(int *)potentialEnergy,(int *)totalEnergy);
  NGA_Access(in_stack_000000a4,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             in_stack_00000080);
  NGA_Access(in_stack_000000a4,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             in_stack_00000080);
  NGA_Access(in_stack_000000a4,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             in_stack_00000080);
  for (local_20 = 0; local_20 < ((local_28 - local_24) + 1) / 3; local_20 = local_20 + 1) {
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      local_38 = *(double *)(local_48 + (long)(local_20 * 3 + local_1c) * 8) * 0.5 *
                 *(double *)(local_48 + (long)(local_20 * 3 + local_1c) * 8) + local_38;
      local_40 = in_stack_ffffffffffffffb0[local_20 * 3 + local_1c] *
                 *(double *)
                  (CONCAT44(in_stack_ffffffffffffffac,local_58) +
                  (long)(local_20 * 3 + local_1c) * 8) + local_40;
    }
  }
  GA_Dgop(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(char *)0x104baf);
  GA_Dgop(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,(char *)0x104bc5);
  *in_RSI = local_38 + in_XMM0_Qa;
  temperature = ((local_38 * 2.0) / 3.0) / (double)in_EDI;
  pressure = gDensity * (temperature + (local_40 / 3.0) / (double)in_EDI);
  measurementStep = measurementStep + 1;
  temperatureSum = temperature + temperatureSum;
  temperatureSqdSum = temperature * temperature + temperatureSqdSum;
  pressureSum = pressure + pressureSum;
  pressureSqdSum = pressure * pressure + pressureSqdSum;
  potentialEnergySum = in_XMM0_Qa + potentialEnergySum;
  potentialEnergySqdSum = in_XMM0_Qa * in_XMM0_Qa + potentialEnergySqdSum;
  kineticEnergySum = local_38 + kineticEnergySum;
  totalEnergySum = *in_RSI + totalEnergySum;
  totalEnergySqdSum = *in_RSI * *in_RSI + totalEnergySqdSum;
  return;
}

Assistant:

void computeProperties(int natoms, double potentialEnergy, 
               double *totalEnergy) {
  
  int i, p, lo, hi, ld, natms;
  double kineticEnergy = 0.0, vir = 0.0;
  double *v, *x, *a;
  
  GA_Sync();
  
  NGA_Distribution(g_V, gMe, &lo, &hi);
  NGA_Access(g_V, &lo, &hi, &v, &ld);
  NGA_Access(g_X, &lo, &hi, &x, &ld);
  NGA_Access(g_G, &lo, &hi, &a, &ld);
  
  natms = (hi-lo+1)/NDIM;
  for (p = 0; p < natms; p++)
    for (i = 0; i < NDIM; i++) {
      kineticEnergy += 0.5 * v[p*NDIM + i] * v[p*NDIM + i];
      vir += x[p*NDIM + i] * a[p*NDIM + i];
    }

  GA_Dgop(&kineticEnergy, 1, "+");
  GA_Dgop(&vir, 1, "+");
  (*totalEnergy) = kineticEnergy + potentialEnergy;

  temperature = 2.0 * kineticEnergy / 3.0 / natoms;
  pressure = temperature + vir / 3.0 / natoms;
  pressure *= gDensity;

  ++measurementStep;
  temperatureSum += temperature;
  temperatureSqdSum += temperature * temperature;
  pressureSum += pressure;
  pressureSqdSum += pressure * pressure;
  potentialEnergySum += potentialEnergy;
  potentialEnergySqdSum += potentialEnergy * potentialEnergy;

  /* for checking the fluctuation */
  kineticEnergySum += kineticEnergy;
  totalEnergySum   += (*totalEnergy);
  totalEnergySqdSum += (*totalEnergy)*(*totalEnergy);
}